

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall Accuracy::SetDataSize(Accuracy *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Accuracy *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->seconds).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->millis).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->micros).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2 + sVar3;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = seconds.EncodedSize() + millis.EncodedSize() + micros.EncodedSize();
		return cbData;
	}